

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O3

void __thiscall
cmGeneratorTarget::ComputeModuleDefinitionInfo
          (cmGeneratorTarget *this,string *config,ModuleDefinitionInfo *info)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  cmMakefile *this_00;
  pointer ppcVar2;
  pointer ppcVar3;
  pointer pcVar4;
  bool bVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string local_60;
  string local_40;
  
  GetModuleDefinitionSources(this,&info->Sources,config);
  this_00 = this->Makefile;
  paVar1 = &local_60.field_2;
  local_60._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_60,"CMAKE_SUPPORT_WINDOWS_EXPORT_ALL_SYMBOLS","");
  bVar5 = cmMakefile::IsOn(this_00,&local_60);
  if (bVar5) {
    local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_40,"WINDOWS_EXPORT_ALL_SYMBOLS","");
    bVar5 = cmTarget::GetPropertyAsBool(this->Target,&local_40);
    info->WindowsExportAllSymbols = bVar5;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    info->WindowsExportAllSymbols = false;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != paVar1) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
  }
  if (info->WindowsExportAllSymbols == false) {
    ppcVar2 = (info->Sources).
              super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    ppcVar3 = (info->Sources).
              super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    bVar5 = (ulong)((long)ppcVar3 - (long)ppcVar2) < 9;
    info->DefFileGenerated = !bVar5;
    if (bVar5) {
      if (ppcVar2 == ppcVar3) {
        return;
      }
      cmSourceFile::GetFullPath_abi_cxx11_(*ppcVar2);
      std::__cxx11::string::_M_assign((string *)info);
      return;
    }
  }
  else {
    info->DefFileGenerated = true;
  }
  pcVar4 = (this->ObjectDirectory)._M_dataplus._M_p;
  local_60._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_60,pcVar4,pcVar4 + (this->ObjectDirectory)._M_string_length);
  std::__cxx11::string::append((char *)&local_60);
  std::__cxx11::string::operator=((string *)info,(string *)&local_60);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != paVar1) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void cmGeneratorTarget::ComputeModuleDefinitionInfo(
  std::string const& config, ModuleDefinitionInfo& info) const
{
  this->GetModuleDefinitionSources(info.Sources, config);
  info.WindowsExportAllSymbols =
    this->Makefile->IsOn("CMAKE_SUPPORT_WINDOWS_EXPORT_ALL_SYMBOLS") &&
    this->GetPropertyAsBool("WINDOWS_EXPORT_ALL_SYMBOLS");
  info.DefFileGenerated =
    info.WindowsExportAllSymbols || info.Sources.size() > 1;
  if (info.DefFileGenerated) {
    info.DefFile = this->ObjectDirectory /* has slash */ + "exports.def";
  } else if (!info.Sources.empty()) {
    info.DefFile = info.Sources.front()->GetFullPath();
  }
}